

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O0

_Bool XPKView_LoadXPKEntry(void)

{
  int iVar1;
  uint8_t *rgba_00;
  char *pcVar2;
  undefined8 uVar3;
  SDL_Surface *surf;
  uint8_t *rgba;
  LPStatus status;
  
  if (app.xpkentry_tx != (SDL_Texture *)0x0) {
    SDL_DestroyTexture(app.xpkentry_tx);
  }
  app.xpkentry = XPK_EntryAtIndex(app.xpk,app.which_entry);
  rgba_00 = XPKEntry_Decode(app.xpkentry,(LPStatus *)&rgba);
  iVar1 = app.which_entry;
  if ((LPStatus)rgba == LUNAPURPURA_OK) {
    uVar3 = SDL_CreateRGBSurfaceWithFormatFrom
                      (rgba_00,(app.xpkentry)->width,(app.xpkentry)->height,0x20,
                       (ulong)(app.xpkentry)->width << 2,0x16762004);
    app.xpkentry_tx = (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar3);
    SDL_FreeSurface(uVar3);
    XPKDecoder_FreeRGBA(rgba_00);
    app.entry_rect.x = (int)(app.xpkentry)->x;
    app.entry_rect.y = (int)(app.xpkentry)->y;
    app.entry_rect.w = (int)(app.xpkentry)->width;
    app.entry_rect.h = (int)(app.xpkentry)->height;
    XPKView_ToggleCentered();
    XPKView_ToggleCentered();
  }
  else {
    pcVar2 = LPStatusString((LPStatus)rgba);
    LPWarn("xpkview","Couldn\'t decode XPK entry #%d! - %s",(ulong)(uint)iVar1,pcVar2);
  }
  return (LPStatus)rgba == LUNAPURPURA_OK;
}

Assistant:

static bool
XPKView_LoadXPKEntry(void)
{
	if (app.xpkentry_tx) SDL_DestroyTexture(app.xpkentry_tx);

	app.xpkentry = XPK_EntryAtIndex(app.xpk, app.which_entry);

	LPStatus status;
	uint8_t *rgba = XPKEntry_Decode(app.xpkentry, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "Couldn't decode XPK entry #%d! - %s", app.which_entry, LPStatusString(status));
		return false;
	}

	SDL_Surface *surf = SDL_CreateRGBSurfaceWithFormatFrom(
		rgba, app.xpkentry->width, app.xpkentry->height, 32, app.xpkentry->width*4, SDL_PIXELFORMAT_RGBA32
	);
	app.xpkentry_tx = SDL_CreateTextureFromSurface(app.renderer, surf);
	SDL_FreeSurface(surf);
	XPKDecoder_FreeRGBA(rgba);

	app.entry_rect.x = app.xpkentry->x;
	app.entry_rect.y = app.xpkentry->y;
	app.entry_rect.w = app.xpkentry->width;
	app.entry_rect.h = app.xpkentry->height;

	/* Do this twice on purpose so that we preserve the current setting. */
	XPKView_ToggleCentered();
	XPKView_ToggleCentered();

	return true;
}